

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  bool bVar1;
  ulong uVar2;
  uint8_t *ptr;
  
  uVar2 = v;
  if (0x7f < v) {
    do {
      *dst = (byte)uVar2 | 0x80;
      dst = (char *)((byte *)dst + 1);
      v = uVar2 >> 7;
      bVar1 = 0x3fff < uVar2;
      uVar2 = v;
    } while (bVar1);
  }
  *dst = (byte)v;
  return (char *)((byte *)dst + 1);
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<uint8_t>(v);
  return reinterpret_cast<char*>(ptr);
}